

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O0

int __thiscall pbrt::ScaleTexture::writeTo(ScaleTexture *this,BinaryWriter *binary)

{
  int32_t iVar1;
  BinaryWriter *in_RSI;
  Texture *in_RDI;
  vec3f *in_stack_ffffffffffffff78;
  BinaryWriter *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  BinaryWriter *in_stack_ffffffffffffffb8;
  
  Texture::writeTo(in_RDI,in_RSI);
  std::shared_ptr<pbrt::Entity>::shared_ptr<pbrt::Texture,void>
            ((shared_ptr<pbrt::Entity> *)in_stack_ffffffffffffff80,
             (shared_ptr<pbrt::Texture> *)in_stack_ffffffffffffff78);
  iVar1 = BinaryWriter::serialize
                    (in_stack_ffffffffffffffb8,
                     (SP *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  BinaryWriter::write<int>(in_stack_ffffffffffffff80,(int *)in_stack_ffffffffffffff78);
  std::shared_ptr<pbrt::Entity>::~shared_ptr((shared_ptr<pbrt::Entity> *)0x122b55);
  std::shared_ptr<pbrt::Entity>::shared_ptr<pbrt::Texture,void>
            ((shared_ptr<pbrt::Entity> *)in_RSI,
             (shared_ptr<pbrt::Texture> *)in_stack_ffffffffffffff78);
  BinaryWriter::serialize(in_stack_ffffffffffffffb8,(SP *)CONCAT44(iVar1,in_stack_ffffffffffffffb0))
  ;
  BinaryWriter::write<int>(in_RSI,(int *)in_stack_ffffffffffffff78);
  std::shared_ptr<pbrt::Entity>::~shared_ptr((shared_ptr<pbrt::Entity> *)0x122baf);
  BinaryWriter::write<pbrt::math::vec3f>(in_RSI,in_stack_ffffffffffffff78);
  BinaryWriter::write<pbrt::math::vec3f>(in_RSI,in_stack_ffffffffffffff78);
  return 0x20;
}

Assistant:

int ScaleTexture::writeTo(BinaryWriter &binary) 
  {
    Texture::writeTo(binary);
    binary.write(binary.serialize(tex1));
    binary.write(binary.serialize(tex2));
    binary.write(scale1);
    binary.write(scale2);
    return TYPE_SCALE_TEXTURE;
  }